

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void FrequencyTable(BSDF *bsdf,Vector3f *wo,RNG *rng,int sampleCount,int thetaRes,int phiRes,
                   Float *target)

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  BSDFSample bs;
  Tuple2<pbrt::Point2,_float> local_60;
  BSDFSample local_54;
  
  memset(target,0,(long)(phiRes * thetaRes) << 2);
  if (0 < sampleCount) {
    do {
      uVar8 = rng->state;
      uVar1 = rng->inc;
      uVar10 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
      bVar5 = (byte)(uVar8 >> 0x3b);
      auVar12 = vcvtusi2ss_avx512f(in_XMM4,uVar10 >> bVar5 | uVar10 << 0x20 - bVar5);
      auVar12 = vminss_avx(ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      uVar8 = uVar8 * 0x5851f42d4c957f2d + uVar1;
      uVar9 = uVar8 * 0x5851f42d4c957f2d + uVar1;
      rng->state = uVar9 * 0x5851f42d4c957f2d + uVar1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar9;
      auVar15 = vpunpcklqdq_avx(auVar14,auVar16);
      auVar11 = vpsrlvq_avx2(auVar15,_DAT_005c85b0);
      auVar14 = vpsrlvq_avx2(auVar15,_DAT_005c85c0);
      auVar11 = vpshufd_avx(auVar11 ^ auVar14,0xe8);
      auVar15 = vpsrlq_avx(auVar15,0x3b);
      auVar15 = vpshufd_avx(auVar15,0xe8);
      auVar11 = vprorvd_avx512vl(auVar11,auVar15);
      auVar15 = vcvtudq2ps_avx512vl(auVar11);
      auVar11._8_4_ = 0x2f800000;
      auVar11._0_8_ = 0x2f8000002f800000;
      auVar11._12_4_ = 0x2f800000;
      auVar11 = vmulps_avx512vl(auVar15,auVar11);
      auVar15._8_4_ = 0x3f7fffff;
      auVar15._0_8_ = 0x3f7fffff3f7fffff;
      auVar15._12_4_ = 0x3f7fffff;
      auVar11 = vminps_avx512vl(auVar11,auVar15);
      local_60 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11);
      pbrt::BSDF::Sample_f
                (&local_54,bsdf,(Vector3f)wo->super_Tuple3<pbrt::Vector3,_float>,auVar12._0_4_,
                 (Point2f *)&local_60,Radiance,All);
      if ((0.0 < local_54.pdf) && (((undefined1)local_54.flags & Specular) == Unset)) {
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_54.wi.super_Tuple3<pbrt::Vector3,_float>.y *
                                                (bsdf->shadingFrame).x.
                                                super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_54.wi.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)(bsdf->shadingFrame).x.
                                                super_Tuple3<pbrt::Vector3,_float>.x));
        auVar11 = vfmadd231ss_fma(auVar12,ZEXT416((uint)local_54.wi.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)(bsdf->shadingFrame).x.
                                                super_Tuple3<pbrt::Vector3,_float>.z));
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_54.wi.super_Tuple3<pbrt::Vector3,_float>.y *
                                                (bsdf->shadingFrame).y.
                                                super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_54.wi.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)(bsdf->shadingFrame).y.
                                                super_Tuple3<pbrt::Vector3,_float>.x));
        auVar15 = vfmadd231ss_fma(auVar12,ZEXT416((uint)local_54.wi.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)(bsdf->shadingFrame).y.
                                                super_Tuple3<pbrt::Vector3,_float>.z));
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_54.wi.super_Tuple3<pbrt::Vector3,_float>.y *
                                                (bsdf->shadingFrame).z.
                                                super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_54.wi.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)(bsdf->shadingFrame).z.
                                                super_Tuple3<pbrt::Vector3,_float>.x));
        auVar14 = vfmadd231ss_fma(auVar12,ZEXT416((uint)local_54.wi.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)(bsdf->shadingFrame).z.
                                                super_Tuple3<pbrt::Vector3,_float>.z));
        auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
        uVar2 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar13 = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar12._0_4_));
        auVar12 = ZEXT416((uint)(fVar13 * ((float)thetaRes / 3.1415927)));
        auVar12 = vroundss_avx(auVar12,auVar12,9);
        fVar13 = atan2f(auVar15._0_4_,auVar11._0_4_);
        fVar13 = ((float)phiRes / 6.2831855) * fVar13;
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)((float)phiRes / 6.2831855)),
                                  ZEXT416(0x40c90fdb));
        uVar6 = ~((int)auVar12._0_4_ >> 0x1f) & (int)auVar12._0_4_;
        uVar10 = thetaRes - 1U;
        if ((int)uVar6 <= (int)(thetaRes - 1U)) {
          uVar10 = uVar6;
        }
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar13),ZEXT416(0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        auVar12 = ZEXT416((uint)bVar3 * auVar11._0_4_ + (uint)!bVar3 * (int)fVar13);
        auVar12 = vroundss_avx(auVar12,auVar12,9);
        uVar7 = ~((int)auVar12._0_4_ >> 0x1f) & (int)auVar12._0_4_;
        uVar6 = phiRes - 1U;
        if ((int)uVar7 <= (int)(phiRes - 1U)) {
          uVar6 = uVar7;
        }
        iVar4 = uVar10 * phiRes + uVar6;
        target[iVar4] = target[iVar4] + 1.0;
      }
      sampleCount = sampleCount + -1;
    } while (sampleCount != 0);
  }
  return;
}

Assistant:

void FrequencyTable(const BSDF* bsdf, const Vector3f& wo, RNG& rng, int sampleCount,
                    int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = thetaRes / Pi, factorPhi = phiRes / (2 * Pi);

    Vector3f wi;
    for (int i = 0; i < sampleCount; ++i) {
        Float u = rng.Uniform<Float>();
        Point2f sample{rng.Uniform<Float>(), rng.Uniform<Float>()};
        BSDFSample bs = bsdf->Sample_f(wo, u, sample);

        if (!bs || bs.IsSpecular())
            continue;

        Vector3f wiL = bsdf->RenderToLocal(bs.wi);

        Point2f coords(SafeACos(wiL.z) * factorTheta,
                       std::atan2(wiL.y, wiL.x) * factorPhi);

        if (coords.y < 0)
            coords.y += 2 * Pi * factorPhi;

        int thetaBin = std::min(std::max(0, (int)std::floor(coords.x)), thetaRes - 1);
        int phiBin = std::min(std::max(0, (int)std::floor(coords.y)), phiRes - 1);

        target[thetaBin * phiRes + phiBin] += 1;
    }
}